

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

void __thiscall
testing::Matcher<mp::StringLiteral>::Matcher(Matcher<mp::StringLiteral> *this,StringLiteral value)

{
  MatcherBase<mp::StringLiteral> local_30;
  BasicExpr<(mp::expr::Kind)70,_(mp::expr::Kind)70> local_18;
  
  (this->super_MatcherBase<mp::StringLiteral>).impl_.value_ =
       (MatcherInterface<mp::StringLiteral> *)0x0;
  (this->super_MatcherBase<mp::StringLiteral>).impl_.link_.next_ =
       &(this->super_MatcherBase<mp::StringLiteral>).impl_.link_;
  (this->super_MatcherBase<mp::StringLiteral>)._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_001caa78;
  local_18.super_ExprBase.impl_ =
       (ExprBase)
       (ExprBase)value.super_BasicExpr<(mp::expr::Kind)70,_(mp::expr::Kind)70>.super_ExprBase.impl_;
  internal::EqMatcher::operator_cast_to_Matcher
            ((Matcher<mp::StringLiteral> *)&local_30,(EqMatcher *)&local_18);
  internal::linked_ptr<const_testing::MatcherInterface<mp::StringLiteral>_>::operator=
            (&(this->super_MatcherBase<mp::StringLiteral>).impl_,&local_30.impl_);
  internal::MatcherBase<mp::StringLiteral>::~MatcherBase(&local_30);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }